

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

bool aheads_masks_init(whisper_context_params *cparams,whisper_hparams *hparams,
                      whisper_aheads_masks *aheads_masks,ggml_backend_t backend)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  vector<float,_std::allocator<float>_> *this;
  pointer ppgVar5;
  size_type sVar6;
  reference ppgVar7;
  key_type *pkVar8;
  reference pvVar9;
  reference pvVar10;
  float *pfVar11;
  undefined8 in_RCX;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t pos;
  size_t ih;
  size_t data_size_bytes;
  size_t data_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aheads_2;
  int64_t il_1;
  vector<float,_std::allocator<float>_> mask_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aheads_1;
  int64_t il;
  ggml_init_params params;
  size_t i;
  whisper_aheads aheads;
  int32_t n_head;
  int32_t n_text_layer;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *this_00;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffe70;
  key_type *in_stack_fffffffffffffe78;
  map<whisper_alignment_heads_preset,_whisper_aheads,_std::less<whisper_alignment_heads_preset>,_std::allocator<std::pair<const_whisper_alignment_heads_preset,_whisper_aheads>_>_>
  *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffeb8;
  whisper_context_params *in_stack_fffffffffffffec8;
  key_type *local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  size_type local_d8;
  vector<float,_std::allocator<float>_> local_d0;
  undefined8 local_b8;
  undefined8 local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  long local_80;
  vector<float,_std::allocator<float>_> *local_78;
  undefined8 local_70;
  float *local_68;
  vector<float,_std::allocator<float>_> *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  ulong local_48;
  ulong local_40;
  whisper_ahead *local_38;
  uint local_30;
  uint local_2c;
  undefined8 local_28;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_20;
  long local_10;
  bool local_1;
  
  local_2c = *(uint *)(in_RSI + 0x20);
  local_30 = *(uint *)(in_RSI + 0x1c);
  if (*(int *)(in_RDI + 0xc) == 0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: dtw_aheads_preset should be != DTW_AHEADS_NONE\n",
               "aheads_masks_init");
    local_1 = false;
    goto LAB_001eb8db;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  if (*(int *)(in_RDI + 0xc) == 1) {
    if (((int)local_2c < *(int *)(in_RDI + 0x10)) || (*(int *)(in_RDI + 0x10) < 1)) {
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: dtw_n_top must be between %d and %d for this model.",
                 "aheads_masks_init",1,(ulong)local_2c);
      local_1 = false;
      goto LAB_001eb8db;
    }
  }
  else {
    local_10 = in_RDI;
    if (*(int *)(in_RDI + 0xc) == 2) {
      in_stack_fffffffffffffec8 = (whisper_context_params *)(in_RDI + 0x18);
    }
    else {
      in_stack_fffffffffffffec8 =
           (whisper_context_params *)
           std::
           map<whisper_alignment_heads_preset,_whisper_aheads,_std::less<whisper_alignment_heads_preset>,_std::allocator<std::pair<const_whisper_alignment_heads_preset,_whisper_aheads>_>_>
           ::at(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    local_40._0_1_ = in_stack_fffffffffffffec8->use_gpu;
    local_40._1_1_ = in_stack_fffffffffffffec8->flash_attn;
    local_40._2_2_ = *(undefined2 *)&in_stack_fffffffffffffec8->field_0x2;
    local_40._4_4_ = in_stack_fffffffffffffec8->gpu_device;
    local_38 = *(whisper_ahead **)&in_stack_fffffffffffffec8->dtw_token_timestamps;
    if (*(int *)(local_10 + 0xc) == 2) {
      if (local_40 == 0) {
        whisper_log_internal
                  (GGML_LOG_LEVEL_ERROR,"%s: dtw_aheads.n_heads should be > 0","aheads_masks_init");
        local_1 = false;
        goto LAB_001eb8db;
      }
      if (local_38 == (whisper_ahead *)0x0) {
        whisper_log_internal(GGML_LOG_LEVEL_ERROR,"%s: dtw_aheads.heads unset","aheads_masks_init");
        local_1 = false;
        goto LAB_001eb8db;
      }
    }
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      if ((int)local_2c <= local_38[local_48].n_text_layer) {
        whisper_log_internal
                  (GGML_LOG_LEVEL_ERROR,
                   "%s: tried to set alignment head on text layer %d, but model only has %d text layers"
                   ,"aheads_masks_init",(ulong)(local_38[local_48].n_text_layer + 1),(ulong)local_2c
                  );
        local_1 = false;
        goto LAB_001eb8db;
      }
      if (local_38[local_48].n_text_layer < 0) {
        whisper_log_internal
                  (GGML_LOG_LEVEL_ERROR,"%s: tried to set alignment head on text layer < 0",
                   "aheads_masks_init");
        local_1 = false;
        goto LAB_001eb8db;
      }
      if ((int)local_30 <= local_38[local_48].n_head) {
        whisper_log_internal
                  (GGML_LOG_LEVEL_ERROR,
                   "%s: tried to set alignment head on head %d, but model only has %d heads",
                   "aheads_masks_init",(ulong)(local_38[local_48].n_head + 1),(ulong)local_30);
        local_1 = false;
        goto LAB_001eb8db;
      }
      if (local_38[local_48].n_head < 0) {
        whisper_log_internal
                  (GGML_LOG_LEVEL_ERROR,"%s: tried to set alignment head on head < 0",
                   "aheads_masks_init");
        local_1 = false;
        goto LAB_001eb8db;
      }
    }
  }
  lVar3 = (long)(int)local_2c;
  lVar4 = ggml_tensor_overhead();
  this = (vector<float,_std::allocator<float>_> *)(lVar3 * lVar4);
  local_58 = 0;
  local_50 = 1;
  local_70 = 0;
  __last._M_current = (float *)CONCAT71(uStack_4f,1);
  this_00 = (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x0;
  local_78 = this;
  local_68 = __last._M_current;
  local_60 = this;
  ppgVar5 = (pointer)ggml_init();
  local_20[1].super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppgVar5;
  if (local_20[1].super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: failed to allocate memory for the aheads_masks context\n",
               "aheads_masks_init");
    local_1 = false;
  }
  else {
    for (local_80 = 0; local_80 < (int)local_2c; local_80 = local_80 + 1) {
      get_alignment_heads_by_layer
                (in_stack_fffffffffffffec8,(int)((ulong)lVar3 >> 0x20),(int)lVar3,
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffffe70._M_current);
      if (bVar2) {
        local_b8 = 0;
        std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back
                  (this_00,(value_type *)this);
      }
      else {
        ppgVar5 = local_20[1].super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar4 = (long)(int)local_30;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_98);
        in_stack_fffffffffffffeb8 = ggml_new_tensor_2d(ppgVar5,0,lVar4,sVar6);
        local_a0 = in_stack_fffffffffffffeb8;
        std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back
                  (this_00,(value_type *)this);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffe70._M_current);
    }
    ppgVar5 = (pointer)ggml_backend_alloc_ctx_tensors
                                 (local_20[1].
                                  super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start,local_28);
    local_20[1].super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppgVar5;
    if (local_20[1].super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: failed to allocate memory for aheads_masks\n",
                 "aheads_masks_init");
      local_1 = false;
    }
    else {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1eb5ae);
      for (local_d8 = 0; (long)local_d8 < (long)(int)local_2c; local_d8 = local_d8 + 1) {
        ppgVar7 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                            (local_20,local_d8);
        if (*ppgVar7 != (value_type)0x0) {
          get_alignment_heads_by_layer
                    (in_stack_fffffffffffffec8,(int)((ulong)lVar3 >> 0x20),(int)lVar3,
                     (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          ppgVar7 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              (local_20,local_d8);
          lVar4 = (*ppgVar7)->ne[0];
          ppgVar7 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              (local_20,local_d8);
          lVar1 = (*ppgVar7)->ne[1];
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe80,
                     (size_type)in_stack_fffffffffffffe78);
          std::vector<float,_std::allocator<float>_>::begin(this);
          std::vector<float,_std::allocator<float>_>::end(this);
          std::
          fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,int>
                    (in_stack_fffffffffffffe70,__last,(int *)this_00);
          for (local_120 = (key_type *)0x0;
              pkVar8 = (key_type *)
                       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_f0),
              local_120 < pkVar8; local_120 = (key_type *)((long)local_120 + 1)) {
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&local_f0,(size_type)local_120);
            in_stack_fffffffffffffe80 =
                 (map<whisper_alignment_heads_preset,_whisper_aheads,_std::less<whisper_alignment_heads_preset>,_std::allocator<std::pair<const_whisper_alignment_heads_preset,_whisper_aheads>_>_>
                  *)(ulong)*pvVar9;
            in_stack_fffffffffffffe78 = local_120;
            ppgVar7 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                                (local_20,local_d8);
            pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                (&local_d0,
                                 (size_type)
                                 (&(in_stack_fffffffffffffe80->_M_t)._M_impl.field_0x0 +
                                 (long)in_stack_fffffffffffffe78 * (*ppgVar7)->ne[0]));
            *pvVar10 = 1.0;
          }
          ppgVar7 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              (local_20,local_d8);
          in_stack_fffffffffffffe70._M_current = (float *)*ppgVar7;
          pfVar11 = std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)0x1eb829);
          ggml_backend_tensor_set(in_stack_fffffffffffffe70._M_current,pfVar11,0,lVar4 * lVar1 * 4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffe70._M_current);
        }
      }
      local_1 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::empty
                          ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                           in_stack_fffffffffffffe70._M_current);
      if (local_1) {
        whisper_log_internal(GGML_LOG_LEVEL_ERROR,"%s: \n","aheads_masks_init");
      }
      local_1 = !local_1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70._M_current);
    }
  }
LAB_001eb8db:
  return (bool)(local_1 & 1);
}

Assistant:

static bool aheads_masks_init(
        const whisper_context_params & cparams,
               const whisper_hparams & hparams,
         struct whisper_aheads_masks & aheads_masks,
                      ggml_backend_t   backend) {

    const int32_t n_text_layer = hparams.n_text_layer;
    const int32_t n_head = hparams.n_text_head;

    // Sanity checks
    if (cparams.dtw_aheads_preset == WHISPER_AHEADS_NONE) {
        WHISPER_LOG_ERROR("%s: dtw_aheads_preset should be != DTW_AHEADS_NONE\n", __func__);
        return false;
    } else if (cparams.dtw_aheads_preset == WHISPER_AHEADS_N_TOP_MOST) {
        if (cparams.dtw_n_top > n_text_layer || cparams.dtw_n_top <= 0) {
            WHISPER_LOG_ERROR("%s: dtw_n_top must be between %d and %d for this model.", __func__, 1, n_text_layer);
            return false;
        }
    } else {
        const auto aheads = cparams.dtw_aheads_preset == WHISPER_AHEADS_CUSTOM ? cparams.dtw_aheads : g_aheads.at(cparams.dtw_aheads_preset);
        if (cparams.dtw_aheads_preset == WHISPER_AHEADS_CUSTOM) {
            if (aheads.n_heads == 0) {
                WHISPER_LOG_ERROR("%s: dtw_aheads.n_heads should be > 0", __func__);
                return false;
            }
            if (aheads.heads == NULL) {
                WHISPER_LOG_ERROR("%s: dtw_aheads.heads unset", __func__);
                return false;
            }
        }
        for (size_t i = 0; i < aheads.n_heads; ++i) {
            if (aheads.heads[i].n_text_layer >= n_text_layer) {
                WHISPER_LOG_ERROR("%s: tried to set alignment head on text layer %d, but model only has %d text layers", __func__, aheads.heads[i].n_text_layer + 1, n_text_layer);
                return false;
            }
            if (aheads.heads[i].n_text_layer < 0) {
                WHISPER_LOG_ERROR("%s: tried to set alignment head on text layer < 0", __func__);
                return false;
            }
            if (aheads.heads[i].n_head >= n_head) {
                WHISPER_LOG_ERROR("%s: tried to set alignment head on head %d, but model only has %d heads", __func__, aheads.heads[i].n_head + 1, n_head);
                return false;
            }
            if (aheads.heads[i].n_head < 0) {
                WHISPER_LOG_ERROR("%s: tried to set alignment head on head < 0", __func__);
                return false;
            }
        }
    }

    struct ggml_init_params params = {
        /*.mem_size   =*/ (size_t) static_cast<size_t>(n_text_layer)*ggml_tensor_overhead(),
        /*.mem_buffer =*/ nullptr,
        /*.no_alloc   =*/ true,
    };

    aheads_masks.ctx = ggml_init(params);

    if (!aheads_masks.ctx) {
        WHISPER_LOG_ERROR("%s: failed to allocate memory for the aheads_masks context\n", __func__);
        return false;
    }

    for (int64_t il = 0; il < n_text_layer; ++il) {
        auto aheads = get_alignment_heads_by_layer(cparams, il, n_text_layer, n_head);
        if (!aheads.empty()) {
            aheads_masks.m.push_back(ggml_new_tensor_2d(aheads_masks.ctx, GGML_TYPE_F32, n_head, aheads.size()));
        } else {
            aheads_masks.m.push_back(nullptr);
        }
    }

    aheads_masks.buffer = ggml_backend_alloc_ctx_tensors(aheads_masks.ctx, backend);
    if (!aheads_masks.buffer) {
        WHISPER_LOG_ERROR("%s: failed to allocate memory for aheads_masks\n", __func__);
        return false;
    }

    // Set data on mask tensors
    // Since this must be backend agnostic, we write our desired values on mask_data,
    // and send it to backend with ggml_backend_tensor_set.
    // Each mask in N_HEADS*N_ALIGNMENT_HEADS, one per text layer containing alignment
    // heads. Each row of the mask "marks" one alignment head. E.g. if some text layer
    // has a total of 10 heads and of those, heads 0,5,6 are alignment heads, the mask
    // should read:
    // 1 0 0 0 0 0 0 0 0 0
    // 0 0 0 0 0 1 0 0 0 0
    // 0 0 0 0 0 0 1 0 0 0
    std::vector<float> mask_data;
    for (int64_t il = 0; il < n_text_layer; ++il) {
        if (aheads_masks.m[il] != nullptr) {
            auto aheads = get_alignment_heads_by_layer(cparams, il, n_text_layer, n_head);

            size_t data_size = aheads_masks.m[il]->ne[0] * aheads_masks.m[il]->ne[1];
            size_t data_size_bytes = data_size * sizeof(float);
            mask_data.resize(data_size);

            std::fill(mask_data.begin(), mask_data.end(), 0);
            for (size_t ih = 0; ih < aheads.size(); ++ih) {
                size_t pos = (aheads[ih] + (ih * aheads_masks.m[il]->ne[0]));
                mask_data[pos] = 1.0f;
            }

            ggml_backend_tensor_set(aheads_masks.m[il], mask_data.data(), 0, data_size_bytes);
        }
    }

    if (aheads_masks.m.empty()) {
        WHISPER_LOG_ERROR("%s: \n", __func__);
        return false;
    }

    return true;
}